

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void init_block(deflate_state *s)

{
  int local_14;
  int n;
  deflate_state *s_local;
  
  for (local_14 = 0; local_14 < 0x11e; local_14 = local_14 + 1) {
    s->dyn_ltree[local_14].fc.freq = 0;
  }
  for (local_14 = 0; local_14 < 0x1e; local_14 = local_14 + 1) {
    s->dyn_dtree[local_14].fc.freq = 0;
  }
  for (local_14 = 0; local_14 < 0x13; local_14 = local_14 + 1) {
    s->bl_tree[local_14].fc.freq = 0;
  }
  s->dyn_ltree[0x100].fc.freq = 1;
  s->static_len = 0;
  s->opt_len = 0;
  s->matches = 0;
  s->sym_next = 0;
  return;
}

Assistant:

local void init_block(deflate_state *s) {
    int n; /* iterates over tree elements */

    /* Initialize the trees. */
    for (n = 0; n < L_CODES;  n++) s->dyn_ltree[n].Freq = 0;
    for (n = 0; n < D_CODES;  n++) s->dyn_dtree[n].Freq = 0;
    for (n = 0; n < BL_CODES; n++) s->bl_tree[n].Freq = 0;

    s->dyn_ltree[END_BLOCK].Freq = 1;
    s->opt_len = s->static_len = 0L;
    s->sym_next = s->matches = 0;
}